

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall deqp::egl::Image::RenderTests::addRenderActions(RenderTests *this)

{
  RenderTexture2D *this_00;
  RenderReadPixelsRenderbuffer *this_01;
  RenderDepthbuffer *this_02;
  RenderStencilbuffer *this_03;
  DefaultDeleter<deqp::egl::Image::Action> local_119;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_118;
  allocator<char> local_101;
  string local_100;
  DefaultDeleter<deqp::egl::Image::Action> local_d9;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_d8;
  allocator<char> local_c1;
  string local_c0;
  DefaultDeleter<deqp::egl::Image::Action> local_99;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_98;
  allocator<char> local_81;
  string local_80;
  DefaultDeleter<deqp::egl::Image::Action> local_59;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_58 [2];
  allocator<char> local_31;
  string local_30;
  RenderTests *local_10;
  RenderTests *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"texture",&local_31);
  this_00 = (RenderTexture2D *)operator_new(8);
  (this_00->super_Render).super_GLES2Action.super_Action._vptr_Action = (_func_int **)0x0;
  GLES2ImageApi::RenderTexture2D::RenderTexture2D(this_00);
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_59);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(local_58,this_00);
  LabeledActions::add(&this->m_renderActions,&local_30,local_58);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(local_58);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"read_pixels",&local_81);
  this_01 = (RenderReadPixelsRenderbuffer *)operator_new(8);
  (this_01->super_Render).super_GLES2Action.super_Action._vptr_Action = (_func_int **)0x0;
  GLES2ImageApi::RenderReadPixelsRenderbuffer::RenderReadPixelsRenderbuffer(this_01);
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_99);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(&local_98,this_01);
  LabeledActions::add(&this->m_renderActions,&local_80,&local_98);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(&local_98);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"depth_buffer",&local_c1);
  this_02 = (RenderDepthbuffer *)operator_new(8);
  (this_02->super_Render).super_GLES2Action.super_Action._vptr_Action = (_func_int **)0x0;
  GLES2ImageApi::RenderDepthbuffer::RenderDepthbuffer(this_02);
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_d9);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(&local_d8,this_02);
  LabeledActions::add(&this->m_renderActions,&local_c0,&local_d8);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(&local_d8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"stencil_buffer",&local_101);
  this_03 = (RenderStencilbuffer *)operator_new(8);
  (this_03->super_Render).super_GLES2Action.super_Action._vptr_Action = (_func_int **)0x0;
  GLES2ImageApi::RenderStencilbuffer::RenderStencilbuffer(this_03);
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_119);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(&local_118,this_03);
  LabeledActions::add(&this->m_renderActions,&local_100,&local_118);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(&local_118);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  return;
}

Assistant:

void RenderTests::addRenderActions (void)
{
	m_renderActions.add("texture",			MovePtr<Action>(new GLES2ImageApi::RenderTexture2D()));
	m_renderActions.add("read_pixels",		MovePtr<Action>(new GLES2ImageApi::RenderReadPixelsRenderbuffer()));
	m_renderActions.add("depth_buffer",		MovePtr<Action>(new GLES2ImageApi::RenderDepthbuffer()));
	m_renderActions.add("stencil_buffer",	MovePtr<Action>(new GLES2ImageApi::RenderStencilbuffer()));
}